

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

void __thiscall
ot::commissioner::Json_ActiveOperationalDatasetEncodingDecoding_Test::
~Json_ActiveOperationalDatasetEncodingDecoding_Test
          (Json_ActiveOperationalDatasetEncodingDecoding_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Json, ActiveOperationalDatasetEncodingDecoding)
{
    const std::string        kNetworkMasterKey = "0123456789abcdef0123456789abcdef";
    ActiveOperationalDataset dataset;

    // network master key serialization & deserialization
    {
        EXPECT_TRUE(utils::Hex(dataset.mNetworkMasterKey, kNetworkMasterKey) == ErrorCode::kNone);
        dataset.mPresentFlags |= ActiveOperationalDataset::kNetworkMasterKeyBit;

        std::string json = ActiveDatasetToJson(dataset);

        ActiveOperationalDataset dataset1;
        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);

        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kNetworkMasterKeyBit));
        EXPECT_TRUE(utils::Hex(dataset1.mNetworkMasterKey) == kNetworkMasterKey);
    }

    // security policy serialization & deserialization
    {
        const ByteArray kSecurityPolicyFlags  = {0x05, 0xff};
        dataset.mSecurityPolicy.mRotationTime = 32;
        dataset.mSecurityPolicy.mFlags        = kSecurityPolicyFlags;
        dataset.mPresentFlags |= ActiveOperationalDataset::kSecurityPolicyBit;

        std::string              json = ActiveDatasetToJson(dataset);
        ActiveOperationalDataset dataset1;

        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);
        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kSecurityPolicyBit));
        EXPECT_EQ(dataset1.mSecurityPolicy.mFlags, kSecurityPolicyFlags);
    }

    // channel mask serialization & deserialization
    {
        dataset.mChannelMask = {{1, {0xFF, 0xEE}}};
        dataset.mPresentFlags |= ActiveOperationalDataset::kChannelMaskBit;

        std::string              json = ActiveDatasetToJson(dataset);
        ActiveOperationalDataset dataset1;

        EXPECT_TRUE(ActiveDatasetFromJson(dataset1, json) == ErrorCode::kNone);
        EXPECT_TRUE((dataset1.mPresentFlags & ActiveOperationalDataset::kChannelMaskBit));
        EXPECT_TRUE(dataset1.mChannelMask.size() == 1);
        EXPECT_TRUE(dataset1.mChannelMask[0].mPage == 1);
        EXPECT_TRUE(dataset1.mChannelMask[0].mMasks == dataset.mChannelMask[0].mMasks);
    }
}